

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_pa_buffer_attr *
ma_device__pa_buffer_attr_new
          (ma_pa_buffer_attr *__return_storage_ptr__,ma_uint32 periodSizeInFrames,ma_uint32 periods,
          ma_pa_sample_spec *ss)

{
  ma_format mVar1;
  uint uVar2;
  
  mVar1 = ma_format_from_pulse(ss->format);
  uVar2 = periodSizeInFrames * periods * (uint)ss->channels *
          *(int *)(&DAT_001127b0 + (ulong)mVar1 * 4);
  __return_storage_ptr__->maxlength = uVar2;
  uVar2 = uVar2 / periods;
  __return_storage_ptr__->tlength = uVar2;
  __return_storage_ptr__->prebuf = 0xffffffff;
  __return_storage_ptr__->minreq = 0xffffffff;
  __return_storage_ptr__->fragsize = uVar2;
  return __return_storage_ptr__;
}

Assistant:

static ma_pa_buffer_attr ma_device__pa_buffer_attr_new(ma_uint32 periodSizeInFrames, ma_uint32 periods, const ma_pa_sample_spec* ss)
{
    ma_pa_buffer_attr attr;
    attr.maxlength = periodSizeInFrames * periods * ma_get_bytes_per_frame(ma_format_from_pulse(ss->format), ss->channels);
    attr.tlength   = attr.maxlength / periods;
    attr.prebuf    = (ma_uint32)-1;
    attr.minreq    = (ma_uint32)-1;
    attr.fragsize  = attr.maxlength / periods;

    return attr;
}